

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

Schema __thiscall capnp::Schema::getDependency(Schema *this,uint64_t id,uint location)

{
  uint uVar1;
  RawBrandedSchema *pRVar2;
  RawSchema *this_00;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  Fault f;
  CappedArray<char,_17UL> local_30;
  
  pRVar2 = this->raw;
  uVar7 = 0;
  uVar6 = pRVar2->dependencyCount;
  while (uVar4 = uVar6, uVar7 < uVar4) {
    uVar6 = uVar7 + uVar4 >> 1;
    uVar1 = pRVar2->dependencies[uVar6].location;
    if (uVar1 == location) {
      pRVar2 = pRVar2->dependencies[uVar6].schema;
      capnp::_::RawBrandedSchema::ensureInitialized(pRVar2);
      return (Schema)pRVar2;
    }
    if (uVar1 < location) {
      uVar7 = uVar6 + 1;
      uVar6 = uVar4;
    }
  }
  uVar6 = 0;
  uVar3 = (ulong)pRVar2->generic->dependencyCount;
  while( true ) {
    uVar5 = uVar3;
    uVar7 = (uint)uVar5;
    if (uVar7 <= uVar6) {
      kj::hex(&local_30,id);
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44],kj::CappedArray<char,17ul>>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
                 ,0xf5,FAILED,(char *)0x0,
                 "\"Requested ID not found in dependency table.\", kj::hex(id)",
                 (char (*) [44])"Requested ID not found in dependency table.",&local_30);
      kj::_::Debug::Fault::~Fault(&f);
      return (Schema)(RawBrandedSchema *)(capnp::_::NULL_SCHEMA + 0x48);
    }
    uVar7 = uVar7 + uVar6 >> 1;
    this_00 = pRVar2->generic->dependencies[uVar7];
    if (this_00->id == id) break;
    uVar3 = (ulong)uVar7;
    if (this_00->id < id) {
      uVar6 = uVar7 + 1;
      uVar3 = uVar5;
    }
  }
  capnp::_::RawSchema::ensureInitialized(this_00);
  return (Schema)&this_00->defaultBrand;
}

Assistant:

Schema Schema::getDependency(uint64_t id, uint location) const {
  {
    // Binary search dependency list.
    uint lower = 0;
    uint upper = raw->dependencyCount;

    while (lower < upper) {
      uint mid = (lower + upper) / 2;

      auto candidate = raw->dependencies[mid];
      if (candidate.location == location) {
        candidate.schema->ensureInitialized();
        return Schema(candidate.schema);
      } else if (candidate.location < location) {
        lower = mid + 1;
      } else {
        upper = mid;
      }
    }
  }

  {
    uint lower = 0;
    uint upper = raw->generic->dependencyCount;

    while (lower < upper) {
      uint mid = (lower + upper) / 2;

      const _::RawSchema* candidate = raw->generic->dependencies[mid];

      uint64_t candidateId = candidate->id;
      if (candidateId == id) {
        candidate->ensureInitialized();
        return Schema(&candidate->defaultBrand);
      } else if (candidateId < id) {
        lower = mid + 1;
      } else {
        upper = mid;
      }
    }
  }

  KJ_FAIL_REQUIRE("Requested ID not found in dependency table.", kj::hex(id)) {
    return Schema();
  }
}